

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O3

void create_response_map(fasthessian *fh)

{
  int init_step;
  ulong uVar1;
  ulong uVar2;
  int height;
  response_layer *prVar3;
  int iVar4;
  int iVar5;
  int height_00;
  
  init_step = fh->step;
  uVar1 = (long)fh->iimage->width / (long)init_step;
  iVar5 = (int)uVar1;
  uVar2 = (long)fh->iimage->height / (long)init_step;
  height = (int)uVar2;
  prVar3 = initialise_response_layer(9,iVar5,height,init_step);
  fh->response_map[0] = prVar3;
  prVar3 = initialise_response_layer(0xf,iVar5,height,init_step);
  fh->response_map[1] = prVar3;
  prVar3 = initialise_response_layer(0x15,iVar5,height,init_step);
  fh->response_map[2] = prVar3;
  prVar3 = initialise_response_layer(0x1b,iVar5,height,init_step);
  fh->response_map[3] = prVar3;
  iVar4 = (int)(((uint)(uVar1 >> 0x1f) & 1) + iVar5) >> 1;
  height_00 = (int)(((uint)(uVar2 >> 0x1f) & 1) + height) >> 1;
  prVar3 = initialise_response_layer(0x27,iVar4,height_00,init_step * 2);
  fh->response_map[4] = prVar3;
  prVar3 = initialise_response_layer(0x33,iVar4,height_00,init_step * 2);
  fh->response_map[5] = prVar3;
  iVar4 = iVar5 + 3;
  if (-1 < iVar5) {
    iVar4 = iVar5;
  }
  iVar5 = height + 3;
  if (-1 < height) {
    iVar5 = height;
  }
  prVar3 = initialise_response_layer(0x4b,iVar4 >> 2,iVar5 >> 2,init_step << 2);
  fh->response_map[6] = prVar3;
  prVar3 = initialise_response_layer(99,iVar4 >> 2,iVar5 >> 2,init_step << 2);
  fh->response_map[7] = prVar3;
  return;
}

Assistant:

void create_response_map(struct fasthessian* fh) {
    int img_width = (fh->iimage)->width;
    int img_height = (fh->iimage)->height;
    int init_step = fh->step;

    int w = img_width / init_step;
    int h = img_height / init_step;

    // Octave 1 - 9, 15, 21, 27
    fh->response_map[0] = initialise_response_layer(9, w, h, init_step);
    fh->response_map[1] = initialise_response_layer(15, w, h, init_step);
    fh->response_map[2] = initialise_response_layer(21, w, h, init_step);
    fh->response_map[3] = initialise_response_layer(27, w, h, init_step);

    // Octave 2 - 15, 27, 39, 51
    fh->response_map[4] = initialise_response_layer(39, w/2, h/2, init_step*2);
    fh->response_map[5] = initialise_response_layer(51, w/2, h/2, init_step*2);

    // Octave 3 - 27, 51, 75, 99
    fh->response_map[6] = initialise_response_layer(75, w/4, h/4, init_step*4);
    fh->response_map[7] = initialise_response_layer(99, w/4, h/4, init_step*4);
}